

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O3

optional<Vault::HttpResponse> * __thiscall
Vault::HttpClient::put
          (optional<Vault::HttpResponse> *__return_storage_ptr__,HttpClient *this,Url *url,
          Token *token,Namespace *ns,string *value)

{
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:76:7)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:76:7)>
             ::_M_manager;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<curl_slist_*(curl_slist_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:80:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<curl_slist_*(curl_slist_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:80:7)>
             ::_M_manager;
  local_28._M_unused._M_object = value;
  executeRequest(__return_storage_ptr__,this,url,token,ns,(CurlSetupCallback *)&local_28,
                 (CurlHeaderCallback *)&local_48,&this->errorCallback_);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::HttpResponse>
Vault::HttpClient::put(const Vault::Url &url, const Vault::Token &token,
                       const Vault::Namespace &ns,
                       const std::string &value) const {
  return executeRequest(
      url, token, ns,
      [&](CURL *curl) {
        curl_easy_setopt(curl, CURLOPT_CUSTOMREQUEST, "PUT");
        curl_easy_setopt(curl, CURLOPT_POSTFIELDS, value.c_str());
      },
      [&](curl_slist *chunk) { return chunk; }, errorCallback_);
}